

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointBeliefEventDriven.cpp
# Opt level: O0

double __thiscall
JointBeliefEventDriven::Update
          (JointBeliefEventDriven *this,MultiAgentDecisionProcessDiscreteInterface *pu,Index lastJAI
          ,Index newJOI)

{
  double dVar1;
  ulong uVar2;
  undefined8 uVar3;
  iterator *__first;
  iterator *piVar4;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first_00;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  iterator *ae;
  vector_expression<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  *e;
  ostream *this_00;
  long *in_RSI;
  const_iterator in_RDI;
  int safety_h;
  int safety_s;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *Haf;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *Oaf;
  vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_> bUpdated;
  vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_> res;
  vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_> b;
  double last_epsilon;
  double epsilon;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  H;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *Hao;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *Oao;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *Ta;
  double eta;
  EventObservationModelMapping *O;
  TransitionModelMapping *T;
  size_t nrS;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffd78;
  EventObservationModelMapping *in_stack_fffffffffffffd80;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffd88;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffd90;
  matrix_expression<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  *in_stack_fffffffffffffd98;
  vector_expression<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  *in_stack_fffffffffffffda0;
  vector_expression<boost::numeric::ublas::matrix_vector_binary2<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_vector_prod2<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_double>_>_>
  *in_stack_fffffffffffffda8;
  E *in_stack_fffffffffffffdb0;
  vector_expression<boost::numeric::ublas::matrix_vector_binary2<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_vector_prod2<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_double>_>_>
  *in_stack_fffffffffffffdb8;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  iterator *__last_00;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe00;
  int local_16c;
  int local_168;
  double local_a8;
  result_type local_48;
  
  uVar2 = (**(code **)(*in_RSI + 0x140))();
  if ((uVar2 & 1) == 0) {
    uVar3 = __cxa_allocate_exception(0x28);
    E::E(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
    __cxa_throw(uVar3,&E::typeinfo,E::~E);
  }
  (**(code **)(*in_RSI + 0x30))();
  __first = (iterator *)(**(code **)(*in_RSI + 0x130))();
  if (__first == (iterator *)0x0) {
    piVar4 = (iterator *)0x0;
  }
  else {
    piVar4 = (iterator *)
             __dynamic_cast(__first,&TransitionModelDiscrete::typeinfo,
                            &TransitionModelMapping::typeinfo,0);
  }
  __last_00 = piVar4;
  __first_00._M_current = (double *)(**(code **)(*in_RSI + 0x138))();
  if (__first_00._M_current == (double *)0x0) {
    __last._M_current = (double *)0x0;
  }
  else {
    __last._M_current =
         (double *)
         __dynamic_cast(__first_00._M_current,&ObservationModelDiscrete::typeinfo,
                        &EventObservationModelMapping::typeinfo,0);
  }
  local_48 = 0.0;
  if ((piVar4 != (iterator *)0x0) &&
     ((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
       *)__last._M_current !=
      (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
       *)0x0)) {
    TransitionModelMapping::GetMatrixPtr
              ((TransitionModelMapping *)in_stack_fffffffffffffd80,
               (Index)((ulong)in_stack_fffffffffffffd78 >> 0x20));
    EventObservationModelMapping::GetMatrixPtr
              (in_stack_fffffffffffffd80,(Index)((ulong)in_stack_fffffffffffffd78 >> 0x20),
               (Index)in_stack_fffffffffffffd78);
    ae = (iterator *)operator_new(0x28);
    boost::numeric::ublas::
    element_prod<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
              (in_stack_fffffffffffffd98,
               (matrix_expression<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                *)in_stack_fffffffffffffd90);
    boost::numeric::ublas::
    matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>
    ::
    matrix<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_multiplies<double,double>>>
              ((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *)__last._M_current,
               (matrix_expression<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>_>
                *)ae);
    boost::numeric::ublas::
    matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>
    ::~matrix_binary((matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>
                      *)in_stack_fffffffffffffd80);
    piVar4 = ae;
    boost::numeric::ublas::
    matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::matrix(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    boost::numeric::ublas::
    vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::vector
              ((vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *)in_stack_fffffffffffffdb0,(size_type)in_stack_fffffffffffffda8);
    std::vector<double,_std::allocator<double>_>::begin
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd78);
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd78);
    boost::numeric::ublas::
    vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::begin
              ((vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *)in_stack_fffffffffffffd78);
    std::
    copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>::iterator>
              (__first_00,__last,piVar4);
    boost::numeric::ublas::
    vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::
    iterator::~iterator((iterator *)0x9bc84b);
    boost::numeric::ublas::
    vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::
    iterator::~iterator((iterator *)0x9bc858);
    boost::numeric::ublas::zero_vector<double,_std::allocator<double>_>::zero_vector
              ((zero_vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd80,
               (size_type)in_stack_fffffffffffffd78);
    boost::numeric::ublas::
    vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>::
    vector<boost::numeric::ublas::zero_vector<double,std::allocator<double>>>
              ((vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *)in_stack_fffffffffffffdb0,
               (vector_expression<boost::numeric::ublas::zero_vector<double,_std::allocator<double>_>_>
                *)in_stack_fffffffffffffda8);
    boost::numeric::ublas::zero_vector<double,_std::allocator<double>_>::~zero_vector
              ((zero_vector<double,_std::allocator<double>_> *)0x9bc893);
    boost::numeric::ublas::
    prod<boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
              ((vector_expression<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                *)in_stack_fffffffffffffd88,
               (matrix_expression<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                *)in_stack_fffffffffffffd80);
    boost::numeric::ublas::
    vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>::
    vector<boost::numeric::ublas::matrix_vector_binary2<boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix_vector_prod2<boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,double>>>
              ((vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    boost::numeric::ublas::
    matrix_vector_binary2<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_vector_prod2<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_double>_>
    ::~matrix_vector_binary2
              ((matrix_vector_binary2<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_vector_prod2<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_double>_>
                *)in_stack_fffffffffffffd80);
    local_a8 = 0.01;
    e = in_stack_fffffffffffffda0;
    if (-1 < *(int *)(in_RDI._M_current + 1)) {
      EventObservationModelMapping::GetMatrixPtr
                (in_stack_fffffffffffffd80,(Index)((ulong)in_stack_fffffffffffffd78 >> 0x20),
                 (Index)in_stack_fffffffffffffd78);
      e = (vector_expression<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
           *)operator_new(0x28);
      boost::numeric::ublas::
      element_prod<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
                (in_stack_fffffffffffffd98,
                 (matrix_expression<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                  *)in_stack_fffffffffffffd90);
      boost::numeric::ublas::
      matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>
      ::
      matrix<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_multiplies<double,double>>>
                ((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                  *)__last._M_current,
                 (matrix_expression<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>_>
                  *)piVar4);
      boost::numeric::ublas::
      matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>
      ::~matrix_binary((matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>
                        *)in_stack_fffffffffffffd80);
      local_168 = 0;
      for (local_16c = 0; dVar1 = local_a8,
          in_stack_fffffffffffffdc7 = 0.01 <= local_a8 && local_16c < 10,
          0.01 <= local_a8 && local_16c < 10; local_16c = local_16c + 1) {
        boost::numeric::ublas::
        prod<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
                  ((matrix_expression<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                    *)in_stack_fffffffffffffd88,
                   (matrix_expression<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                    *)in_stack_fffffffffffffd80);
        boost::numeric::ublas::
        noalias<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
                  (in_stack_fffffffffffffd78);
        boost::numeric::ublas::
        noalias_proxy<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
        ::operator=((noalias_proxy<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                     *)in_stack_fffffffffffffd80,
                    (matrix_matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_matrix_prod<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_double>_>
                     *)in_stack_fffffffffffffd78);
        boost::numeric::ublas::
        noalias_proxy<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
        ::~noalias_proxy((noalias_proxy<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                          *)in_stack_fffffffffffffd80);
        boost::numeric::ublas::
        matrix_matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_matrix_prod<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_double>_>
        ::~matrix_matrix_binary
                  ((matrix_matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_matrix_prod<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_double>_>
                    *)in_stack_fffffffffffffd80);
        boost::numeric::ublas::
        prod<boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
                  ((vector_expression<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                    *)in_stack_fffffffffffffd88,
                   (matrix_expression<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                    *)in_stack_fffffffffffffd80);
        boost::numeric::ublas::
        vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>::
        operator=((vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                  in_stack_fffffffffffffdb8);
        boost::numeric::ublas::
        matrix_vector_binary2<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_vector_prod2<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_double>_>
        ::~matrix_vector_binary2
                  ((matrix_vector_binary2<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_vector_prod2<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_double>_>
                    *)in_stack_fffffffffffffd80);
        boost::numeric::ublas::operator+
                  ((vector_expression<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                    *)in_stack_fffffffffffffd98,
                   (vector_expression<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                    *)in_stack_fffffffffffffd90);
        boost::numeric::ublas::
        vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>::
        operator=((vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                  (vector_expression<boost::numeric::ublas::vector_binary<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_plus<double,_double>_>_>
                   *)in_stack_fffffffffffffdb8);
        boost::numeric::ublas::
        vector_binary<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_plus<double,_double>_>
        ::~vector_binary((vector_binary<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_plus<double,_double>_>
                          *)in_stack_fffffffffffffd80);
        in_stack_fffffffffffffdb8 =
             (vector_expression<boost::numeric::ublas::matrix_vector_binary2<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_vector_prod2<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_double>_>_>
              *)boost::numeric::ublas::
                sum<boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
                          (in_stack_fffffffffffffda0);
        if (0.0 < (double)in_stack_fffffffffffffdb8) {
          local_a8 = boost::numeric::ublas::
                     sum<boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
                               (in_stack_fffffffffffffda0);
        }
        if (((dVar1 == 0.0) && (!NAN(dVar1))) || (local_a8 < dVar1)) {
          local_168 = 0;
        }
        else {
          local_168 = local_168 + 1;
        }
        if (9 < local_168) {
          this_00 = std::operator<<((ostream *)&std::cout,
                                    "Warning: Event-driven belief update not converging! - The system has non-observable chains."
                                   );
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
          break;
        }
      }
      if (e != (vector_expression<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                *)0x0) {
        boost::numeric::ublas::
        matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::~matrix((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   *)in_stack_fffffffffffffd80);
        operator_delete(e,0x28);
      }
    }
    local_48 = boost::numeric::ublas::
               sum<boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
                         (e);
    if (local_48 <= 0.0) {
      in_stack_fffffffffffffd80 =
           (EventObservationModelMapping *)
           std::operator<<((ostream *)&std::cout,
                           "Event-driven belief update failed: The system is badly conditioned. There is 0 probability of observing this symbol given this belief."
                          );
      std::ostream::operator<<(in_stack_fffffffffffffd80,std::endl<char,std::char_traits<char>>);
    }
    else {
      boost::numeric::ublas::operator/
                ((vector_expression<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                  *)in_stack_fffffffffffffd88,(double *)in_stack_fffffffffffffd80);
      boost::numeric::ublas::
      vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>::
      operator=((vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                (vector_expression<boost::numeric::ublas::vector_binary_scalar2<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_const_double,_boost::numeric::ublas::scalar_divides<double,_double>_>_>
                 *)in_stack_fffffffffffffdb8);
      boost::numeric::ublas::
      vector_binary_scalar2<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_const_double,_boost::numeric::ublas::scalar_divides<double,_double>_>
      ::~vector_binary_scalar2
                ((vector_binary_scalar2<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_const_double,_boost::numeric::ublas::scalar_divides<double,_double>_>
                  *)in_stack_fffffffffffffd80);
      std::vector<double,_std::allocator<double>_>::clear
                ((vector<double,_std::allocator<double>_> *)0x9bceb5);
      std::vector<double,_std::allocator<double>_>::end
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd78);
      __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
      __normal_iterator<double*>
                ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *
                 )in_stack_fffffffffffffd80,
                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                 in_stack_fffffffffffffd78);
      boost::numeric::ublas::
      vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::
      begin((vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             *)in_stack_fffffffffffffd78);
      boost::numeric::ublas::
      vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::end
                ((vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                  *)in_stack_fffffffffffffd88);
      std::vector<double,std::allocator<double>>::
      insert<boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>::iterator,void>
                (in_stack_fffffffffffffe00,in_RDI,__first,__last_00);
      boost::numeric::ublas::
      vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::
      iterator::~iterator((iterator *)0x9bcf64);
      boost::numeric::ublas::
      vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::
      iterator::~iterator((iterator *)0x9bcf71);
    }
    if (ae != (iterator *)0x0) {
      boost::numeric::ublas::
      matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::~matrix((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 *)in_stack_fffffffffffffd80);
      operator_delete(ae,0x28);
    }
    boost::numeric::ublas::
    vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::
    ~vector((vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             *)in_stack_fffffffffffffd80);
    boost::numeric::ublas::
    vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::
    ~vector((vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             *)in_stack_fffffffffffffd80);
    boost::numeric::ublas::
    vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::
    ~vector((vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             *)in_stack_fffffffffffffd80);
    boost::numeric::ublas::
    matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::~matrix((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               *)in_stack_fffffffffffffd80);
  }
  return local_48;
}

Assistant:

double JointBeliefEventDriven::Update(const MultiAgentDecisionProcessDiscreteInterface &pu,
                                      Index lastJAI, Index newJOI)
{
    using namespace boost::numeric::ublas;

    if(!pu.GetEventObservability())
        throw E("Trying to use a JointBeliefEventDriven on a model without event observability.");

    size_t nrS = pu.GetNrStates();
    
    const TransitionModelMapping *T = dynamic_cast<const TransitionModelMapping *>(pu.GetTransitionModelDiscretePtr());
    const EventObservationModelMapping *O = dynamic_cast<const EventObservationModelMapping *>(pu.GetObservationModelDiscretePtr());
    double eta = 0;
    if(T != 0 && O != 0)
    {
        using namespace boost::numeric::ublas;
      
        //we need to break the abstraction here since we'll be using ublas over T and O.
        //Ideally, we could have some kind of built in conversion.
        const matrix<double>* Ta = T->GetMatrixPtr(lastJAI);
        const matrix<double>* Oao = O->GetMatrixPtr(lastJAI,newJOI);
        matrix<double>* Hao = new matrix<double>(element_prod(*Ta,*Oao));
      
        matrix<double> H = *Hao;
      
        double epsilon, last_epsilon = 0;
      
        //We need b in ublas form.
        boost::numeric::ublas::vector<double> b(nrS);
        std::copy(_m_b.begin(), _m_b.end(), b.begin());

        boost::numeric::ublas::vector<double> res = zero_vector<double>(nrS);
        boost::numeric::ublas::vector<double> bUpdated = prod(b,H);
        epsilon = JointBeliefEventDriven_convergenceTh;
        if(_m_falseNegativeObs >= 0)
        {
            const matrix<double>* Oaf = O->GetMatrixPtr(lastJAI,_m_falseNegativeObs);
            //At this point we have two |S|x|S| matrices
            //What we want to do is; 
            //Hao = Ta.*Oao;
            //Haf = Ta.*Oaf;
            //b' = (b^T * (inv(I - Haf) * Hao))/n
            //Since we can't compute the inverse of arbitrarily large matrices, we have to approximate this
            //by cutting off the respective power series (I + Haf + Haf^2 + Haf^3 + ...) at some point.
            //Since Ta, Oao, Oaf are defined over (s,s') and we want to avoid having to transpose,
            //we have to left-multiply this by b^T to get the update
            //We also cannot rely on determinant / trace, so we have to keep track of b' and see if it is converging.

            matrix<double>* Haf = new matrix<double>(element_prod(*Ta,*Oaf));
            for(int safety_s=0, safety_h=0; 
                epsilon >= JointBeliefEventDriven_convergenceTh && safety_h < JointBeliefEventDriven_hardCap;
                safety_h++)
            {
                noalias(H) = prod(*Haf, H); //remember that we are implicitly using transposes.
                res = prod(b,H);
              
                bUpdated = bUpdated + res;
                last_epsilon = epsilon;
                if(sum(bUpdated) > 0)
                    epsilon = sum(res);
              
                if(last_epsilon != 0 && epsilon >= last_epsilon){
                    safety_s++;
                }else{
                    safety_s=0;
                }
                if(safety_s >= JointBeliefEventDriven_softCap){
                    cout << "Warning: Event-driven belief update not converging! - The system has non-observable chains." << endl;
                    break;
                }
            }
      
            delete Haf;
        }
        //only the normalization factor remains
        eta = sum(bUpdated);

        if(eta > 0)
        {
            bUpdated = bUpdated / eta;
      
            _m_b.clear();
            _m_b.insert(_m_b.end(), bUpdated.begin(), bUpdated.end());
        }
        else
        {
            cout << "Event-driven belief update failed: The system is badly conditioned. There is 0 probability of observing this symbol given this belief." << endl;
        }  
      
        delete Hao;      
    }
    
#if JointBeliefEventDriven_doSanityCheckAfterEveryUpdate
    if(!SanityCheck())
        throw(E("JointBeliefEventDriven::Update SanityCheck failed"));
#endif

    return(eta);
}